

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLLinOp::MLLinOp(MLLinOp *this)

{
  RealVect *in_RDI;
  
  (((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
     *)in_RDI->vect)->
  super___uniq_ptr_impl<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>_>
  )._M_t.
  super__Tuple_impl<0UL,_amrex::MLLinOp::CommContainer_*,_std::default_delete<amrex::MLLinOp::CommContainer>_>
  .super__Head_base<0UL,_amrex::MLLinOp::CommContainer_*,_false>._M_head_impl =
       (CommContainer *)&PTR__MLLinOp_018043e0;
  LPInfo::LPInfo((LPInfo *)
                 ((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
                   *)in_RDI->vect + 1));
  *(undefined4 *)
   ((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
     *)in_RDI[1].vect + 2) = 0;
  *(undefined4 *)
   ((long)((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
            *)in_RDI[1].vect + 2) + 4) = 3;
  *(undefined1 *)
   &(((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
       *)in_RDI[2].vect)->
    super___uniq_ptr_impl<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>_>
    )._M_t.
    super__Tuple_impl<0UL,_amrex::MLLinOp::CommContainer_*,_std::default_delete<amrex::MLLinOp::CommContainer>_>
    .super__Head_base<0UL,_amrex::MLLinOp::CommContainer_*,_false>._M_head_impl = 1;
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x12645ba);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x12645c8);
  ((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
    *)in_RDI[4].vect)[1] =
       (__uniq_ptr_impl<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>_>
        )0x0;
  IntVect::IntVect((IntVect *)
                   ((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
                     *)in_RDI[4].vect + 2));
  *(undefined1 *)
   ((long)&(((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
              *)in_RDI[5].vect)->
           super___uniq_ptr_impl<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>_>
           )._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp::CommContainer_*,_std::default_delete<amrex::MLLinOp::CommContainer>_>
           .super__Head_base<0UL,_amrex::MLLinOp::CommContainer_*,_false>._M_head_impl + 4) = 0;
  *(undefined1 *)
   ((long)&(((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
              *)in_RDI[5].vect)->
           super___uniq_ptr_impl<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>_>
           )._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp::CommContainer_*,_std::default_delete<amrex::MLLinOp::CommContainer>_>
           .super__Head_base<0UL,_amrex::MLLinOp::CommContainer_*,_false>._M_head_impl + 5) = 0;
  *(undefined1 *)
   ((long)&(((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
              *)in_RDI[5].vect)->
           super___uniq_ptr_impl<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>_>
           )._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp::CommContainer_*,_std::default_delete<amrex::MLLinOp::CommContainer>_>
           .super__Head_base<0UL,_amrex::MLLinOp::CommContainer_*,_false>._M_head_impl + 6) = 0;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x12645fb);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::Vector((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
            *)0x126460c);
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ::Vector((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            *)0x126461d);
  Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ::Vector((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
            *)0x126462e);
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::Vector((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
            *)0x126463f);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x1264650);
  *(undefined4 *)
   ((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
     *)in_RDI[0xb].vect + 1) = 0;
  *(undefined4 *)
   ((long)((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
            *)in_RDI[0xb].vect + 1) + 4) = 0;
  std::unique_ptr<amrex::MLLinOp::CommContainer,std::default_delete<amrex::MLLinOp::CommContainer>>
  ::unique_ptr<std::default_delete<amrex::MLLinOp::CommContainer>,void>
            ((unique_ptr<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>_>
              *)in_RDI);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            *)0x1264686);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            *)0x1264697);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            *)0x12646a8);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            *)0x12646b9);
  memset(in_RDI + 0x10,0,0x18);
  (((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
     *)in_RDI[0x10].vect)->
  super___uniq_ptr_impl<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>_>
  )._M_t.
  super__Tuple_impl<0UL,_amrex::MLLinOp::CommContainer_*,_std::default_delete<amrex::MLLinOp::CommContainer>_>
  .super__Head_base<0UL,_amrex::MLLinOp::CommContainer_*,_false>._M_head_impl = (CommContainer *)0x0
  ;
  ((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
    *)in_RDI[0x10].vect)[1] =
       (__uniq_ptr_impl<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>_>
        )0x0;
  ((__uniq_ptr_data<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>,_true,_true>
    *)in_RDI[0x10].vect)[2] =
       (__uniq_ptr_impl<amrex::MLLinOp::CommContainer,_std::default_delete<amrex::MLLinOp::CommContainer>_>
        )0x0;
  memset(in_RDI + 0x11,0,0x18);
  in_RDI[0x11].vect[0] = 0.0;
  in_RDI[0x11].vect[1] = 0.0;
  in_RDI[0x11].vect[2] = 0.0;
  *(undefined4 *)((long)in_RDI[0x12].vect + 4) = 0xffffffff;
  RealVect::RealVect(in_RDI);
  in_RDI[0x13].vect[1] = 0.0;
  return;
}

Assistant:

MLLinOp::MLLinOp () {}